

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gl4cSparseTextureTests.cpp
# Opt level: O2

bool __thiscall
gl4cts::SparseTextureCommitmentTestCase::commitTexturePage
          (SparseTextureCommitmentTestCase *this,Functions *gl,GLint target,GLint format,
          GLuint *texture,GLint level)

{
  uint uVar1;
  int iVar2;
  GLenum err;
  ostream *poVar3;
  TestError *this_00;
  GLint height;
  GLint width;
  ulong local_40;
  uint local_34;
  
  poVar3 = std::operator<<((ostream *)&this->field_0x88,"Commit Region [level: ");
  poVar3 = (ostream *)std::ostream::operator<<(poVar3,level);
  std::operator<<(poVar3,"] - ");
  if ((this->mState).levels + -1 < level) {
    this_00 = (TestError *)__cxa_allocate_exception(0x38);
    tcu::TestError::TestError
              (this_00,"Invalid level",(char *)0x0,
               "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cSparseTextureTests.cpp"
               ,0x839);
    __cxa_throw(this_00,&tcu::TestError::typeinfo,tcu::Exception::~Exception);
  }
  iVar2 = (*(this->super_TestCase).super_TestCase.super_TestNode._vptr_TestNode[0xd])
                    (this,(ulong)(uint)target,level);
  if (((char)iVar2 != '\0') &&
     (iVar2 = (*(this->super_TestCase).super_TestCase.super_TestNode._vptr_TestNode[0xe])
                        (this,(ulong)(uint)target,level), (char)iVar2 != '\0')) {
    SparseTextureUtils::getTextureLevelSize
              (target,&this->mState,level,&width,&height,(GLint *)&local_34);
    uVar1 = local_34 * 6;
    if (target != 0x8513) {
      uVar1 = local_34;
    }
    local_40 = (long)width / 2 & 0xffffffff;
    gl4cts::Texture::Bind(gl,*texture,target);
    (*(this->super_TestCase).super_TestCase.super_TestNode._vptr_TestNode[5])
              (this,gl,(ulong)(uint)target,(ulong)(uint)format,texture,level,0,0,0,local_40,
               (ulong)(uint)height,(ulong)uVar1,1);
    err = (*gl->getError)();
    glu::checkError(err,"texPageCommitment",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cSparseTextureTests.cpp"
                    ,0x84e);
    return true;
  }
  poVar3 = std::operator<<((ostream *)&this->field_0x88,"Skip commitment [level: ");
  poVar3 = (ostream *)std::ostream::operator<<(poVar3,level);
  std::operator<<(poVar3,"] - ");
  return false;
}

Assistant:

bool SparseTextureCommitmentTestCase::commitTexturePage(const Functions& gl, GLint target, GLint format,
														GLuint& texture, GLint level)
{
	mLog << "Commit Region [level: " << level << "] - ";

	if (level > mState.levels - 1)
		TCU_FAIL("Invalid level");

	// Avoid not allowed commitments
	if (!isInPageSizesRange(target, level) || !isPageSizesMultiplication(target, level))
	{
		mLog << "Skip commitment [level: " << level << "] - ";
		return false;
	}

	GLint width;
	GLint height;
	GLint depth;
	SparseTextureUtils::getTextureLevelSize(target, mState, level, width, height, depth);

	if (target == GL_TEXTURE_CUBE_MAP)
		depth = 6 * depth;

	GLint widthCommitted = width / 2;

	Texture::Bind(gl, texture, target);
	texPageCommitment(gl, target, format, texture, level, 0, 0, 0, widthCommitted, height, depth, GL_TRUE);
	GLU_EXPECT_NO_ERROR(gl.getError(), "texPageCommitment");

	return true;
}